

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::
cumulative_characteristic_function_of_diagram
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Persistence_intervals *this,double x_min,double x_max,size_t number_of_bins)

{
  size_type sVar1;
  reference pvVar2;
  size_type local_70;
  size_t i;
  double sum;
  allocator<double> local_4a;
  undefined1 local_49;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> intsOfBars;
  size_t number_of_bins_local;
  double x_max_local;
  double x_min_local;
  Persistence_intervals *this_local;
  vector<double,_std::allocator<double>_> *result;
  
  intsOfBars.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)number_of_bins;
  characteristic_function_of_diagram
            ((vector<double,_std::allocator<double>_> *)local_48,this,x_min,x_max,number_of_bins);
  local_49 = 0;
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_48);
  std::allocator<double>::allocator(&local_4a);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,sVar1,&local_4a);
  std::allocator<double>::~allocator(&local_4a);
  i = 0;
  for (local_70 = 0;
      sVar1 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_48), local_70 != sVar1;
      local_70 = local_70 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_48,local_70);
    i = (size_t)(*pvVar2 + (double)i);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,local_70);
    *pvVar2 = (value_type)i;
  }
  local_49 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Persistence_intervals::cumulative_characteristic_function_of_diagram(double x_min, double x_max,
                                                                                         size_t number_of_bins) const {
  std::vector<double> intsOfBars = this->characteristic_function_of_diagram(x_min, x_max, number_of_bins);
  std::vector<double> result(intsOfBars.size());
  double sum = 0;
  for (size_t i = 0; i != intsOfBars.size(); ++i) {
    sum += intsOfBars[i];
    result[i] = sum;
  }
  return result;
}